

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

TermList Kernel::SubstHelper::applyImpl<false,Shell::Rectify>
                   (TermList trm,Rectify *applicator,bool noSharing)

{
  bool bVar1;
  undefined1 in_stack_000003df;
  Rectify *in_stack_000003e0;
  Term *in_stack_000003e8;
  Term *in_stack_ffffffffffffffc8;
  TermList *in_stack_ffffffffffffffd0;
  TermList local_10;
  uint64_t local_8;
  
  bVar1 = TermList::isOrdinaryVar((TermList *)0xcefe70);
  if (bVar1) {
    TermList::var(&local_10);
    local_8 = (uint64_t)Shell::Rectify::apply((Rectify *)in_stack_ffffffffffffffc8,0);
  }
  else {
    bVar1 = TermList::isSpecialVar((TermList *)0xcefea7);
    if (bVar1) {
      TermList::var(&local_10);
      local_8 = (uint64_t)
                SubstHelper_Aux::SpecVarHandler<false>::apply<Shell::Rectify>
                          ((Rectify *)in_stack_ffffffffffffffc8,0);
    }
    else {
      TermList::term((TermList *)0xcefede);
      applyImpl<false,Shell::Rectify>(in_stack_000003e8,in_stack_000003e0,(bool)in_stack_000003df);
      TermList::TermList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return (TermList)local_8;
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}